

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

OnCallSpec<test_result_(double)> * __thiscall
testing::internal::OnCallSpec<test_result_(double)>::WillByDefault
          (OnCallSpec<test_result_(double)> *this,Action<test_result_(double)> *action)

{
  Clause CVar1;
  ActionInterface<test_result_(double)> *pAVar2;
  allocator local_41;
  string local_40;
  
  CVar1 = (this->super_UntypedOnCallSpecBase).last_clause_;
  std::__cxx11::string::string
            ((string *)&local_40,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_41);
  UntypedOnCallSpecBase::ExpectSpecProperty
            (&this->super_UntypedOnCallSpecBase,(int)CVar1 < 2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_UntypedOnCallSpecBase).last_clause_ = kWillByDefault;
  pAVar2 = (action->impl_).value_;
  std::__cxx11::string::string
            ((string *)&local_40,"DoDefault() cannot be used in ON_CALL().",&local_41);
  UntypedOnCallSpecBase::ExpectSpecProperty
            (&this->super_UntypedOnCallSpecBase,
             pAVar2 != (ActionInterface<test_result_(double)> *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  linked_ptr<testing::ActionInterface<test_result_(double)>_>::operator=
            (&(this->action_).impl_,&action->impl_);
  return this;
}

Assistant:

OnCallSpec& WillByDefault(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ < kWillByDefault,
                       ".WillByDefault() must appear "
                       "exactly once in an ON_CALL().");
    last_clause_ = kWillByDefault;

    ExpectSpecProperty(!action.IsDoDefault(),
                       "DoDefault() cannot be used in ON_CALL().");
    action_ = action;
    return *this;
  }